

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

Node * __thiscall State::SpellcheckNode(State *this,string *path)

{
  bool bVar1;
  pointer ppVar2;
  StringPiece local_58;
  int local_44;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> _Stack_40;
  int distance;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_38;
  iterator i;
  Node *result;
  int min_distance;
  int kMaxValidEditDistance;
  bool kAllowReplacements;
  string *path_local;
  State *this_local;
  
  result._4_4_ = 4;
  i.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)(__node_type *)0x0;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
       ::begin(&this->paths_);
  while( true ) {
    _Stack_40._M_cur =
         (__node_type *)
         std::
         unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
         ::end(&this->paths_);
    bVar1 = std::__detail::operator!=(&local_38,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)
                        &local_38);
    StringPiece::StringPiece(&local_58,path);
    local_44 = EditDistance(&ppVar2->first,&local_58,true,3);
    if (local_44 < result._4_4_) {
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)
                          &local_38);
      if (ppVar2->second != (Node *)0x0) {
        result._4_4_ = local_44;
        ppVar2 = std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)
                            &local_38);
        i.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur =
             (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)ppVar2->second;
      }
    }
    std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)&local_38);
  }
  return (Node *)i.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur.
                 _M_cur;
}

Assistant:

Node* State::SpellcheckNode(const string& path) {
  const bool kAllowReplacements = true;
  const int kMaxValidEditDistance = 3;

  int min_distance = kMaxValidEditDistance + 1;
  Node* result = NULL;
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i) {
    int distance = EditDistance(
        i->first, path, kAllowReplacements, kMaxValidEditDistance);
    if (distance < min_distance && i->second) {
      min_distance = distance;
      result = i->second;
    }
  }
  return result;
}